

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

bool testing::internal::ParseInt32(Message *src_text,char *str,int32_t *value)

{
  undefined8 uVar1;
  Message *this;
  Message *this_00;
  Message *val;
  int *in_RDX;
  char *in_RSI;
  Message msg_1;
  int32_t result;
  Message msg;
  long long_value;
  char *end;
  Message *in_stack_ffffffffffffff08;
  Message *in_stack_ffffffffffffff10;
  Message *in_stack_ffffffffffffff18;
  Message *in_stack_ffffffffffffff40;
  string local_98 [44];
  int local_6c;
  string local_68 [56];
  long local_30;
  char *local_28;
  int *local_20;
  byte local_1;
  
  local_28 = (char *)0x0;
  local_20 = in_RDX;
  local_30 = strtol(in_RSI,&local_28,10);
  if (*local_28 == '\0') {
    local_6c = (int)local_30;
    if (((local_30 == 0x7fffffffffffffff) || (local_30 == -0x8000000000000000)) ||
       (local_6c != local_30)) {
      Message::Message(in_stack_ffffffffffffff40);
      Message::operator<<(in_stack_ffffffffffffff10,(char (*) [10])in_stack_ffffffffffffff08);
      Message::operator<<(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      this = Message::operator<<(in_stack_ffffffffffffff10,(char (*) [50])in_stack_ffffffffffffff08)
      ;
      this_00 = Message::operator<<(in_stack_ffffffffffffff10,
                                    (char (*) [12])in_stack_ffffffffffffff08);
      val = Message::operator<<(this_00,(char **)in_stack_ffffffffffffff08);
      Message::operator<<(this_00,(char (*) [20])val);
      Message::GetString_abi_cxx11_(this);
      uVar1 = std::__cxx11::string::c_str();
      printf("%s",uVar1);
      std::__cxx11::string::~string(local_98);
      fflush(_stdout);
      local_1 = 0;
      Message::~Message((Message *)0x11b393);
    }
    else {
      *local_20 = local_6c;
      local_1 = 1;
    }
  }
  else {
    Message::Message(in_stack_ffffffffffffff40);
    Message::operator<<(in_stack_ffffffffffffff10,(char (*) [10])in_stack_ffffffffffffff08);
    Message::operator<<(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    Message::operator<<(in_stack_ffffffffffffff10,(char (*) [50])in_stack_ffffffffffffff08);
    Message::operator<<(in_stack_ffffffffffffff10,(char (*) [13])in_stack_ffffffffffffff08);
    Message::operator<<(in_stack_ffffffffffffff10,(char **)in_stack_ffffffffffffff08);
    Message::operator<<(in_stack_ffffffffffffff10,(char (*) [4])in_stack_ffffffffffffff08);
    Message::GetString_abi_cxx11_(in_stack_ffffffffffffff18);
    uVar1 = std::__cxx11::string::c_str();
    printf("%s",uVar1);
    std::__cxx11::string::~string(local_68);
    fflush(_stdout);
    local_1 = 0;
    Message::~Message((Message *)0x11b1fa);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ParseInt32(const Message& src_text, const char* str, int32_t* value) {
  // Parses the environment variable as a decimal integer.
  char* end = nullptr;
  const long long_value = strtol(str, &end, 10);  // NOLINT

  // Has strtol() consumed all characters in the string?
  if (*end != '\0') {
    // No - an invalid character was encountered.
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value \"" << str << "\".\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  // Is the parsed value in the range of an int32_t?
  const auto result = static_cast<int32_t>(long_value);
  if (long_value == LONG_MAX || long_value == LONG_MIN ||
      // The parsed value overflows as a long.  (strtol() returns
      // LONG_MAX or LONG_MIN when the input overflows.)
      result != long_value
      // The parsed value overflows as an int32_t.
  ) {
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually" << " has value "
        << str << ", which overflows.\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  *value = result;
  return true;
}